

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::PrimitiveColumnWriter::FlushPage
          (PrimitiveColumnWriter *this,PrimitiveColumnWriterState *state)

{
  unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *this_00;
  _Head_base<0UL,_duckdb::MemoryStream_*,_false> _Var1;
  reference pvVar2;
  type this_01;
  idx_t iVar3;
  InternalException *this_02;
  allocator local_49;
  string local_48;
  
  if (state->current_page <=
      (ulong)(((long)(state->write_info).
                     super_vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                     .
                     super__Vector_base<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(state->write_info).
                    super_vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                    .
                    super__Vector_base<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x220)) {
    pvVar2 = vector<duckdb::PageWriteInformation,_true>::get<true>
                       (&state->write_info,state->current_page - 1);
    this_00 = &pvVar2->temp_writer;
    this_01 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
              operator*(this_00);
    (*(this->super_ColumnWriter)._vptr_ColumnWriter[0xd])
              (this,this_01,
               (pvVar2->page_state).
               super_unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
               .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl);
    iVar3 = MemoryStream::GetPosition(this_01);
    if (iVar3 >> 0x1f != 0) {
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,
                 "Parquet writer: %d uncompressed page size out of range for type integer",&local_49
                );
      iVar3 = MemoryStream::GetPosition(this_01);
      InternalException::InternalException<unsigned_long>(this_02,&local_48,iVar3);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar3 = MemoryStream::GetPosition(this_01);
    (pvVar2->page_header).uncompressed_page_size = (int32_t)iVar3;
    ColumnWriter::CompressPage
              (&this->super_ColumnWriter,this_01,&pvVar2->compressed_size,&pvVar2->compressed_data,
               &pvVar2->compressed_buf);
    (pvVar2->page_header).compressed_page_size = (int32_t)pvVar2->compressed_size;
    if ((pvVar2->compressed_buf).pointer != (data_ptr_t)0x0) {
      _Var1._M_head_impl =
           (this_00->
           super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)._M_t.
           super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>
           .super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl;
      (this_00->super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>).
      _M_t.super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
      super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl = (MemoryStream *)0x0;
      if (_Var1._M_head_impl != (MemoryStream *)0x0) {
        (**(code **)(*(long *)&(_Var1._M_head_impl)->super_WriteStream + 0x10))();
        return;
      }
    }
  }
  return;
}

Assistant:

void PrimitiveColumnWriter::FlushPage(PrimitiveColumnWriterState &state) {
	D_ASSERT(state.current_page > 0);
	if (state.current_page > state.write_info.size()) {
		return;
	}

	// compress the page info
	auto &write_info = state.write_info[state.current_page - 1];
	auto &temp_writer = *write_info.temp_writer;
	auto &hdr = write_info.page_header;

	FlushPageState(temp_writer, write_info.page_state.get());

	// now that we have finished writing the data we know the uncompressed size
	if (temp_writer.GetPosition() > idx_t(NumericLimits<int32_t>::Maximum())) {
		throw InternalException("Parquet writer: %d uncompressed page size out of range for type integer",
		                        temp_writer.GetPosition());
	}
	hdr.uncompressed_page_size = UnsafeNumericCast<int32_t>(temp_writer.GetPosition());

	// compress the data
	CompressPage(temp_writer, write_info.compressed_size, write_info.compressed_data, write_info.compressed_buf);
	hdr.compressed_page_size = UnsafeNumericCast<int32_t>(write_info.compressed_size);
	D_ASSERT(hdr.uncompressed_page_size > 0);
	D_ASSERT(hdr.compressed_page_size > 0);

	if (write_info.compressed_buf) {
		// if the data has been compressed, we no longer need the uncompressed data
		D_ASSERT(write_info.compressed_buf.get() == write_info.compressed_data);
		write_info.temp_writer.reset();
	}
}